

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O1

ggml_cgraph * __thiscall llama_context::graph_init(llama_context *this)

{
  ggml_context *pgVar1;
  int iVar2;
  pointer __p;
  size_t sVar3;
  ggml_cgraph *pgVar4;
  int iVar5;
  
  __p = (pointer)ggml_init();
  std::__uniq_ptr_impl<ggml_context,_ggml_context_deleter>::reset
            ((__uniq_ptr_impl<ggml_context,_ggml_context_deleter> *)&this->ctx_compute,__p);
  pgVar1 = (this->ctx_compute)._M_t.super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
           super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
           super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl;
  sVar3 = llama_model::n_tensors(this->model);
  iVar2 = (int)sVar3 * 5;
  iVar5 = 0x10000;
  if (0x10000 < iVar2) {
    iVar5 = iVar2;
  }
  pgVar4 = (ggml_cgraph *)ggml_new_graph_custom(pgVar1,iVar5,0);
  return pgVar4;
}

Assistant:

ggml_cgraph * llama_context::graph_init() {
    ggml_init_params params = {
        /*.mem_size   =*/ buf_compute_meta.size(),
        /*.mem_buffer =*/ buf_compute_meta.data(),
        /*.no_alloc   =*/ true,
    };

    ctx_compute.reset(ggml_init(params));

    return ggml_new_graph_custom(ctx_compute.get(), graph_max_nodes(), false);
}